

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_cost_enc.c
# Opt level: O0

void PositionOrphanInterval(CostManager *manager,CostInterval *current,CostInterval *previous)

{
  bool bVar1;
  CostInterval *in_RDX;
  CostInterval *in_RSI;
  CostManager *in_RDI;
  CostInterval *local_18;
  
  local_18 = in_RDX;
  if (in_RDX == (CostInterval *)0x0) {
    local_18 = in_RDI->head;
  }
  while( true ) {
    bVar1 = false;
    if (local_18 != (CostInterval *)0x0) {
      bVar1 = in_RSI->start < local_18->start;
    }
    if (!bVar1) break;
    local_18 = local_18->previous;
  }
  while( true ) {
    bVar1 = false;
    if ((local_18 != (CostInterval *)0x0) && (bVar1 = false, local_18->next != (CostInterval *)0x0))
    {
      bVar1 = local_18->next->start < in_RSI->start;
    }
    if (!bVar1) break;
    local_18 = local_18->next;
  }
  if (local_18 == (CostInterval *)0x0) {
    ConnectIntervals(in_RDI,in_RSI,in_RDI->head);
  }
  else {
    ConnectIntervals(in_RDI,in_RSI,local_18->next);
  }
  ConnectIntervals(in_RDI,local_18,in_RSI);
  return;
}

Assistant:

static WEBP_INLINE void PositionOrphanInterval(CostManager* const manager,
                                               CostInterval* const current,
                                               CostInterval* previous) {
  assert(current != NULL);

  if (previous == NULL) previous = manager->head;
  while (previous != NULL && current->start < previous->start) {
    previous = previous->previous;
  }
  while (previous != NULL && previous->next != NULL &&
         previous->next->start < current->start) {
    previous = previous->next;
  }

  if (previous != NULL) {
    ConnectIntervals(manager, current, previous->next);
  } else {
    ConnectIntervals(manager, current, manager->head);
  }
  ConnectIntervals(manager, previous, current);
}